

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f_wipe.cpp
# Opt level: O3

bool wipe_doBurn(int ticks)

{
  int iVar1;
  BYTE *pBVar2;
  long lVar3;
  BYTE *pBVar4;
  short *psVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  byte bVar10;
  int iVar11;
  short *psVar12;
  BYTE *pBVar13;
  long lVar14;
  int iVar15;
  DFrameBuffer *pDVar16;
  
  burntime = burntime + ticks;
  if (ticks == 0) {
    iVar11 = 0;
  }
  else {
    iVar6 = ticks * -2;
    do {
      iVar6 = iVar6 + 1;
      density = wipe_CalcBurn(burnarray,0x40,0x40,density);
      iVar11 = -(density >> 0x1f);
      if (iVar11 != 0) break;
    } while (iVar6 != 0);
  }
  pBVar2 = burnarray;
  bVar10 = (byte)iVar11;
  iVar6 = (screen->super_DSimpleCanvas).super_DCanvas.Width;
  uVar9 = 0;
  iVar1 = (screen->super_DSimpleCanvas).super_DCanvas.Height;
  if (0 < iVar1) {
    pBVar13 = (screen->super_DSimpleCanvas).super_DCanvas.Buffer;
    iVar8 = 0;
    psVar5 = wipe_scr_end;
    psVar12 = wipe_scr_start;
    pDVar16 = screen;
    do {
      lVar3 = (long)(pDVar16->super_DSimpleCanvas).super_DCanvas.Width;
      if (0 < lVar3) {
        lVar14 = 0;
        iVar15 = 0;
        do {
          bVar10 = pBVar2[(int)((iVar15 >> 0x10) + (uVar9 >> 10 & 0x1fffc0))];
          if (bVar10 < 0x7e) {
            if (bVar10 < 2) {
              pBVar4 = (BYTE *)((long)psVar12 + lVar14);
            }
            else {
              uVar7 = Col2RGB8[(byte)(0x40 - (bVar10 >> 1))][*(byte *)((long)psVar12 + lVar14)] +
                      Col2RGB8[bVar10 >> 1][*(byte *)((long)psVar5 + lVar14)] | 0x1f07c1f;
              pBVar4 = RGB32k.All + (uVar7 >> 0xf & uVar7);
            }
            iVar11 = 0;
          }
          else {
            pBVar4 = (BYTE *)((long)psVar5 + lVar14);
          }
          pBVar13[lVar14] = *pBVar4;
          lVar14 = lVar14 + 1;
          iVar15 = iVar15 + (int)(0x400000 / (long)iVar6);
          lVar3 = (long)(screen->super_DSimpleCanvas).super_DCanvas.Width;
          pDVar16 = screen;
        } while (lVar14 < lVar3);
      }
      bVar10 = (byte)iVar11;
      psVar12 = (short *)((long)psVar12 + lVar3);
      psVar5 = (short *)((long)psVar5 + lVar3);
      pBVar13 = pBVar13 + (pDVar16->super_DSimpleCanvas).super_DCanvas.Pitch;
      iVar8 = iVar8 + 1;
      uVar9 = uVar9 + (int)(0x400000 / (long)iVar1);
    } while (iVar8 < (pDVar16->super_DSimpleCanvas).super_DCanvas.Height);
  }
  return (bool)(0x28 < burntime | bVar10 & 1);
}

Assistant:

bool wipe_doBurn (int ticks)
{
	bool done;

	burntime += ticks;
	ticks *= 2;

	// Make the fire burn
	done = false;
	while (!done && ticks--)
	{
		density = wipe_CalcBurn(burnarray, FIREWIDTH, FIREHEIGHT, density);
		done = (density < 0);
	}

	// Draw the screen
	int xstep, ystep, firex, firey;
	int x, y;
	BYTE *to, *fromold, *fromnew;
	const int SHIFT = 16;

	xstep = (FIREWIDTH << SHIFT) / SCREENWIDTH;
	ystep = (FIREHEIGHT << SHIFT) / SCREENHEIGHT;
	to = screen->GetBuffer();
	fromold = (BYTE *)wipe_scr_start;
	fromnew = (BYTE *)wipe_scr_end;

	for (y = 0, firey = 0; y < SCREENHEIGHT; y++, firey += ystep)
	{
		for (x = 0, firex = 0; x < SCREENWIDTH; x++, firex += xstep)
		{
			int fglevel;

			fglevel = burnarray[(firex>>SHIFT)+(firey>>SHIFT)*FIREWIDTH] / 2;
			if (fglevel >= 63)
			{
				to[x] = fromnew[x];
			}
			else if (fglevel == 0)
			{
				to[x] = fromold[x];
				done = false;
			}
			else
			{
				int bglevel = 64-fglevel;
				DWORD *fg2rgb = Col2RGB8[fglevel];
				DWORD *bg2rgb = Col2RGB8[bglevel];
				DWORD fg = fg2rgb[fromnew[x]];
				DWORD bg = bg2rgb[fromold[x]];
				fg = (fg+bg) | 0x1f07c1f;
				to[x] = RGB32k.All[fg & (fg>>15)];
				done = false;
			}
		}
		fromold += SCREENWIDTH;
		fromnew += SCREENWIDTH;
		to += SCREENPITCH;
	}

	return done || (burntime > 40);
}